

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O0

QCollator * __thiscall
anon_unknown.dwarf_a1291b::GenerationalCollator::collator(GenerationalCollator *this)

{
  int iVar1;
  QCollator *in_RDI;
  long in_FS_OFFSET;
  int currentGeneration;
  QCollator *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  QCollator *this_00;
  
  this_00 = *(QCollator **)(in_FS_OFFSET + 0x28);
  iVar1 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x4c229d);
  if (*(int *)&in_RDI[1].d != iVar1) {
    *(int *)&in_RDI[1].d = iVar1;
    QCollator::QCollator(this_00);
    QCollator::operator=((QCollator *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_RDI);
    QCollator::~QCollator(in_stack_ffffffffffffffd0);
  }
  if (*(QCollator **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QCollator &collator()
    {
        int currentGeneration = QLocalePrivate::s_generation.loadRelaxed();
        if (Q_UNLIKELY(generation != currentGeneration)) {
            // reinitialize the collator
            generation = currentGeneration;
            theCollator = QCollator();
        }
        return theCollator;
    }